

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O1

void __thiscall Acceptor::do_accept(Acceptor *this)

{
  uint __errnum;
  int iVar1;
  Logger *pLVar2;
  uint *puVar3;
  char *pcVar4;
  mutex *__mutex;
  int connfd;
  TcpConnSP conn;
  EventLoop *sub_loop;
  socklen_t conn_addrlen;
  sockaddr_in conn_addr;
  socklen_t *in_stack_ffffffffffffff88;
  undefined4 uVar5;
  undefined1 local_65;
  int local_64;
  TcpConnection *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  EventLoop *local_50;
  socklen_t local_44;
  sockaddr_in local_40;
  
  local_44 = 0x10;
  while( true ) {
    while( true ) {
      local_64 = accept(this->ac_listen_fd,(sockaddr *)&local_40,&local_44);
      uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      if (local_64 != -1) break;
      puVar3 = (uint *)__errno_location();
      __errnum = *puVar3;
      if (__errnum == 4) {
        if (-1 < pr_level) {
          printf("[%-5s][%s:%d] accept fail, errno=EINTR, continue\n","error","do_accept",0x48);
        }
      }
      else if (__errnum == 0x18) {
        if (0 < pr_level) {
          printf("[%-5s][%s:%d] accept fail, errno=EMFILE, use idle fd\n","warn","do_accept",0x4c);
        }
        close(this->ac_idle_fd);
        iVar1 = accept(this->ac_listen_fd,(sockaddr *)0x0,(socklen_t *)0x0);
        this->ac_idle_fd = iVar1;
        close(iVar1);
        iVar1 = open("/dev/null",0x80000);
        this->ac_idle_fd = iVar1;
      }
      else {
        if (__errnum == 0xb) {
          if (-1 < pr_level) {
            printf("[%-5s][%s:%d] accept fail, errno=EAGAIN, break\n","error","do_accept",0x53);
          }
          return;
        }
        if (-1 < pr_level) {
          pcVar4 = strerror(__errnum);
          printf("[%-5s][%s:%d] accept fail, error no:%d, error str:%s\n","error","do_accept",0x57,
                 (ulong)__errnum,pcVar4);
        }
      }
    }
    pLVar2 = Logger::get_instance();
    if ((pLVar2->l_inited == false) && (-1 < pr_level)) {
      printf("[%-5s][%s:%d] logger must be inited before user!\n","error","do_accept",0x5c);
    }
    if (1 < (int)g_log_level) {
      pLVar2 = Logger::get_instance();
      Logger::write_log(pLVar2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/net/acceptor.cpp"
                        ,"do_accept",0x5c,LOG_LEVEL_INFO,"accepted one connection, sock fd is %d\n",
                        CONCAT44(uVar5,local_64));
      pLVar2 = Logger::get_instance();
      Logger::flush(pLVar2);
    }
    local_50 = TcpServer::get_next_loop(this->ac_server);
    in_stack_ffffffffffffff88 = &local_44;
    std::__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<TcpConnection>,TcpServer*&,EventLoop*&,int&,sockaddr_in&,unsigned_int&>
              ((__shared_ptr<TcpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (allocator<TcpConnection> *)&local_65,&this->ac_server,&local_50,&local_64,&local_40,
               &local_44);
    std::function<void_(const_std::shared_ptr<TcpConnection>_&)>::operator=
              (&local_60->tc_connected_cb,&this->ac_server->ts_connected_cb);
    std::function<void_(const_std::shared_ptr<TcpConnection>_&,_InputBuffer_*)>::operator=
              (&local_60->tc_message_cb,&this->ac_server->ts_message_cb);
    std::function<void_()>::operator=(&local_60->tc_close_cb,&this->ac_server->ts_close_cb);
    TcpConnection::add_task(local_60);
    __mutex = &this->ac_server->ts_mutex;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) break;
    TcpServer::add_new_tcp_conn(this->ac_server,(TcpConnSP *)&local_60);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void Acceptor::do_accept()
{
    int connfd;
    struct sockaddr_in conn_addr;
    socklen_t conn_addrlen = sizeof conn_addr;
     while(true) {
        if (connfd = accept(ac_listen_fd, (struct sockaddr*)&conn_addr, &conn_addrlen); connfd == -1) {
            if (errno == EINTR) {
                PR_ERROR("accept fail, errno=EINTR, continue\n");
                continue;
            }
            else if (errno == EMFILE) {
                PR_WARN("accept fail, errno=EMFILE, use idle fd\n");
                close(ac_idle_fd);
                ac_idle_fd = accept(ac_listen_fd, NULL, NULL);
                close(ac_idle_fd);
                ac_idle_fd = open("/dev/null", O_RDONLY | O_CLOEXEC);
            }
            else if (errno == EAGAIN) {
                PR_ERROR("accept fail, errno=EAGAIN, break\n");
                break;
            }
            else {
                PR_ERROR("accept fail, error no:%d, error str:%s\n", errno,strerror(errno));
                continue;
            }
        }
        else {
LOG_INFO("accepted one connection, sock fd is %d\n", connfd);
            EventLoop* sub_loop = ac_server->get_next_loop();
            
            TcpConnSP conn = make_shared<TcpConnection>(ac_server, sub_loop, connfd, conn_addr, conn_addrlen);
            conn->set_connected_cb(ac_server->ts_connected_cb);
            conn->set_message_cb(ac_server->ts_message_cb);
            conn->set_close_cb(ac_server->ts_close_cb);
            conn->add_task();

            lock_guard<mutex> lck(ac_server->ts_mutex);
            ac_server->add_new_tcp_conn(conn);     
        }
    }
}